

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O0

void kca_inertial_acceleration(kca_joint *joint,ga_twist *xd,ga_acc_twist *xdd)

{
  ga_acc_twist *xdd_local;
  ga_twist *xd_local;
  kca_joint *joint_local;
  
  if (joint == (kca_joint *)0x0) {
    __assert_fail("joint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x38,
                  "void kca_inertial_acceleration(const struct kca_joint *, const struct ga_twist *, struct ga_acc_twist *)"
                 );
  }
  if (xd == (ga_twist *)0x0) {
    __assert_fail("xd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x39,
                  "void kca_inertial_acceleration(const struct kca_joint *, const struct ga_twist *, struct ga_acc_twist *)"
                 );
  }
  if (xdd == (ga_acc_twist *)0x0) {
    __assert_fail("xdd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x3a,
                  "void kca_inertial_acceleration(const struct kca_joint *, const struct ga_twist *, struct ga_acc_twist *)"
                 );
  }
  if (xd->frame == (frame *)0x0) {
    __assert_fail("xd->frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x3b,
                  "void kca_inertial_acceleration(const struct kca_joint *, const struct ga_twist *, struct ga_acc_twist *)"
                 );
  }
  if (xd->frame->origin == (point *)0x0) {
    __assert_fail("xd->frame->origin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x3c,
                  "void kca_inertial_acceleration(const struct kca_joint *, const struct ga_twist *, struct ga_acc_twist *)"
                 );
  }
  if (xd->point != xd->frame->origin) {
    __assert_fail("xd->point == xd->frame->origin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x3d,
                  "void kca_inertial_acceleration(const struct kca_joint *, const struct ga_twist *, struct ga_acc_twist *)"
                 );
  }
  if (xd->target_body != joint->target_body) {
    __assert_fail("xd->target_body == joint->target_body",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x3e,
                  "void kca_inertial_acceleration(const struct kca_joint *, const struct ga_twist *, struct ga_acc_twist *)"
                 );
  }
  if (xd->frame == joint->target_frame) {
    xdd->target_body = joint->target_body;
    xdd->reference_body = joint->reference_body;
    xdd->frame = joint->target_frame;
    xdd->point = joint->target_frame->origin;
    return;
  }
  __assert_fail("xd->frame == joint->target_frame",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,0x3f,
                "void kca_inertial_acceleration(const struct kca_joint *, const struct ga_twist *, struct ga_acc_twist *)"
               );
}

Assistant:

void kca_inertial_acceleration(
        const struct kca_joint *joint,
        const struct ga_twist *xd,
        struct ga_acc_twist *xdd)
{
    assert(joint);
    assert(xd);
    assert(xdd);
    assert(xd->frame);
    assert(xd->frame->origin);
    assert(xd->point == xd->frame->origin);         // screw twist
    assert(xd->target_body == joint->target_body);
    assert(xd->frame == joint->target_frame);

    xdd->target_body = joint->target_body;
    xdd->reference_body = joint->reference_body;
    xdd->frame = joint->target_frame;
    xdd->point = joint->target_frame->origin;
}